

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

string * __thiscall
punky::ast::Program::to_string_abi_cxx11_(string *__return_storage_ptr__,Program *this)

{
  bool bVar1;
  pointer pSVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  reference local_40;
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  StmtNodeVector *__range2;
  Program *this_local;
  string *prog_str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::
           vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
           ::begin(&this->m_statements);
  stmt = (unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *)
         std::
         vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>
         ::end(&this->m_statements);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
                                     *)&stmt), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
               ::operator*(&__end2);
    pSVar2 = std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::
             operator->(local_40);
    (*(pSVar2->super_AstNode)._vptr_AstNode[3])(&local_80);
    std::operator+(&local_60,&local_80,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_*,_std::vector<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>,_std::allocator<std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>_>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Program::to_string() const
{
    std::string prog_str;
    for (const auto& stmt : m_statements)
        prog_str.append(stmt->to_string() + "\n");
    return prog_str;
}